

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O2

int get_token_from_fp(FILE *fp,char *buff,char d)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  *buff = '\0';
  iVar1 = feof((FILE *)fp);
  if (iVar1 == 0) {
    uVar2 = fgetc((FILE *)fp);
    uVar3 = 0;
    if ((int)(char)uVar2 != (uint)(byte)d) {
      while ((uVar2 & 0xfb) == 9 || (char)uVar2 == '\n') {
        iVar1 = feof((FILE *)fp);
        if (iVar1 != 0) goto LAB_0016f50c;
        uVar2 = getc((FILE *)fp);
      }
      uVar3 = 0;
      while ((((uVar2 & 0xfb) != 9 && ((uVar2 & 0xff) != 10)) && ((int)(char)uVar2 != (uint)(byte)d)
             )) {
        iVar1 = feof((FILE *)fp);
        if (iVar1 != 0) break;
        buff[uVar3] = (char)uVar2;
        uVar2 = fgetc((FILE *)fp);
        uVar3 = uVar3 + 1;
      }
      buff = buff + (uVar3 & 0xffffffff);
    }
    iVar1 = (int)uVar3;
    *buff = '\0';
  }
  else {
LAB_0016f50c:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int get_token_from_fp(FILE * fp, char *buff, char d)
{
   char c;
   int i;

   buff[0] = '\0';

   if (feof(fp))
      return 0;
   c = fgetc(fp);
   if (c == d) {
      buff[0] = '\0';
      return 0;
   }

   while (c == '\n' || c == '\r' || c == '\t') {
      if (feof(fp))
         return 0;
      c = getc(fp);
   }

   for (i = 0; c != d && c != '\n' && c != '\r' && c != '\t' && !feof(fp); i++) {
      buff[i] = c;
      c = fgetc(fp);
   }

   buff[i] = '\0';
   return i;
}